

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

value loader_impl_metadata_handle_context(loader_handle_impl handle_impl)

{
  value *ppvVar1;
  value pvVar2;
  long in_RDI;
  value v;
  value *v_ptr;
  scope in_stack_00000028;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  char *local_8;
  
  local_8 = (char *)value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    ppvVar1 = value_to_array((value)0x132dac);
    pvVar2 = value_create_string(local_8,in_stack_ffffffffffffffd8);
    *ppvVar1 = pvVar2;
    if (*ppvVar1 == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (char *)0x0;
    }
    else {
      context_scope(*(context *)(in_RDI + 0x1020));
      pvVar2 = scope_metadata(in_stack_00000028);
      ppvVar1[1] = pvVar2;
      if (ppvVar1[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value loader_impl_metadata_handle_context(loader_handle_impl handle_impl)
{
	static const char name[] = "scope";

	value *v_ptr, v = value_create_array(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_ptr = value_to_array(v);

	v_ptr[0] = value_create_string(name, sizeof(name) - 1);

	if (v_ptr[0] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	v_ptr[1] = scope_metadata(context_scope(handle_impl->ctx));

	if (v_ptr[1] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	return v;
}